

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<kj::OwnFd>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2630:30)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<kj::OwnFd>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2630:30)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Promise<kj::OwnFd>_> *pEVar1;
  Maybe<kj::OwnFd> *in;
  Promise<kj::OwnFd> local_548;
  ExceptionOr<kj::Promise<kj::OwnFd>_> local_540;
  Maybe<kj::OwnFd> *local_398;
  Maybe<kj::OwnFd> *depValue;
  Maybe<kj::OwnFd> *_depValue779;
  Exception *local_1e0;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1c0 [8];
  ExceptionOr<kj::Maybe<kj::OwnFd>_> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::Maybe<kj::OwnFd>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2630:30)>
  *this_local;
  
  depResult._416_8_ = output;
  ExceptionOr<kj::Maybe<kj::OwnFd>_>::ExceptionOr((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)local_1c0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1c0);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1c0);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<kj::Maybe<kj::OwnFd>>
                         ((Maybe<kj::Maybe<kj::OwnFd>_> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (Maybe<kj::OwnFd> *)0x0) {
      local_398 = depValue;
      in = mv<kj::Maybe<kj::OwnFd>>(depValue);
      MaybeVoidCaller<kj::Maybe<kj::OwnFd>,kj::Promise<kj::OwnFd>>::
      apply<kj::AsyncCapabilityStream::receiveFd()::__0>
                ((MaybeVoidCaller<kj::Maybe<kj::OwnFd>,kj::Promise<kj::OwnFd>> *)&local_548,
                 (Type *)&this->field_0x20,in);
      TransformPromiseNodeBase::handle<kj::Promise<kj::OwnFd>>
                (&local_540,&this->super_TransformPromiseNodeBase,&local_548);
      pEVar1 = ExceptionOrValue::as<kj::Promise<kj::OwnFd>>((ExceptionOrValue *)depResult._416_8_);
      ExceptionOr<kj::Promise<kj::OwnFd>_>::operator=(pEVar1,&local_540);
      ExceptionOr<kj::Promise<kj::OwnFd>_>::~ExceptionOr(&local_540);
      Promise<kj::OwnFd>::~Promise(&local_548);
    }
  }
  else {
    local_1e0 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Promise<kj::OwnFd>_>::ExceptionOr
              ((ExceptionOr<kj::Promise<kj::OwnFd>_> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<kj::Promise<kj::OwnFd>>((ExceptionOrValue *)depResult._416_8_);
    ExceptionOr<kj::Promise<kj::OwnFd>_>::operator=
              (pEVar1,(ExceptionOr<kj::Promise<kj::OwnFd>_> *)&_depValue779);
    ExceptionOr<kj::Promise<kj::OwnFd>_>::~ExceptionOr
              ((ExceptionOr<kj::Promise<kj::OwnFd>_> *)&_depValue779);
  }
  ExceptionOr<kj::Maybe<kj::OwnFd>_>::~ExceptionOr((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)local_1c0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }